

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O2

int wirelength(Tree t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Branch *pBVar5;
  int iVar6;
  int iVar7;
  
  pBVar5 = t.branch;
  iVar7 = t.deg * 2;
  iVar3 = 2;
  if (2 < iVar7) {
    iVar3 = iVar7;
  }
  iVar7 = 0;
  for (lVar4 = 0; (ulong)(iVar3 - 2) * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    iVar1 = *(int *)((long)&pBVar5->n + lVar4);
    iVar6 = *(int *)((long)&pBVar5->x + lVar4) - pBVar5[iVar1].x;
    iVar2 = -iVar6;
    if (0 < iVar6) {
      iVar2 = iVar6;
    }
    iVar6 = *(int *)((long)&pBVar5->y + lVar4) - pBVar5[iVar1].y;
    iVar1 = -iVar6;
    if (0 < iVar6) {
      iVar1 = iVar6;
    }
    iVar7 = iVar2 + iVar7 + iVar1;
  }
  return iVar7;
}

Assistant:

DTYPE wirelength(Tree t)
{
    int i, j;
    DTYPE l=0;

    for (i=0; i<2*t.deg-2; i++) {
        j = t.branch[i].n;
        l += ADIFF(t.branch[i].x, t.branch[j].x)
            + ADIFF(t.branch[i].y, t.branch[j].y);
    }

    return l;
}